

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void responsive_thread(void)

{
  handler_id_type hVar1;
  int local_28;
  int local_24;
  int local_20;
  int i;
  size_t local_18;
  anon_class_1_0_00000001_for_m_object local_d;
  int local_c;
  
  local_c = 0xd;
  hVar1 = handlebars::dispatcher<int>::connect<responsive_thread()::__0>(&local_c,&local_d);
  local_18 = hVar1.index;
  local_20 = hVar1.signal;
  for (local_24 = 0; local_24 < 100; local_24 = local_24 + 1) {
    local_28 = 0xd;
    handlebars::dispatcher<int>::push_event<>(&local_28);
  }
  while ((is_running & 1U) != 0) {
    handlebars::dispatcher<int>::respond(0);
  }
  return;
}

Assistant:

void
responsive_thread()
{
  d::connect(13, [] {
    std::cout << "responding!\n";
    std::this_thread::sleep_for(50ms);
  });
  for (int i = 0; i < 100; ++i) {
    d::push_event(13);
  }
  while (is_running) {
    d::respond();
  }
}